

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

Scal __thiscall LinearExpert::queryX(LinearExpert *this,X *x)

{
  XZ *dst;
  ZZ *this_00;
  double *pdVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  undefined8 *puVar7;
  Index index_1;
  long lVar8;
  RhsNested RVar9;
  undefined1 *puVar10;
  ulong uVar11;
  Index index;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  Index *pIVar15;
  long lVar16;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  double *pdVar17;
  Scal SVar18;
  double dVar19;
  X dx;
  scalar_sum_op<double,_double> local_c1;
  double local_c0;
  Matrix<double,__1,__1,_0,__1,__1> local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_a0;
  double local_80;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_78;
  void *local_50;
  char local_38;
  
  if (this->recompute == true) {
    local_78.m_lhs = &this->invPsi;
    dst = &this->PsiLambda;
    local_78.m_rhs.m_lhs.m_lhs = &this->Lambda;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
              (dst,(Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                    *)&local_78,(assign_op<double,_double> *)&local_a0);
    local_78.m_lhs = (LhsNested)&this->Lambda;
    local_78.m_rhs.m_lhs.m_lhs = dst;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
              (&this->LambdaPsiLambda,
               (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)&local_78,(assign_op<double,_double> *)&local_a0,(type)0x0);
    this_00 = &this->pred_z_invVar;
    pdVar17 = (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    pdVar14 = (this->LambdaPsiLambda).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    lVar13 = (this->LambdaPsiLambda).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    lVar8 = (this->LambdaPsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_storage.m_cols;
    if (((this->pred_z_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != lVar13) ||
       ((this->pred_z_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != lVar8)) {
      if ((lVar8 != 0 && lVar13 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar8),0) < lVar13)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = operator_delete;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_00,lVar8 * lVar13,lVar13,lVar8);
      lVar13 = (this->pred_z_invVar).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      lVar8 = (this->pred_z_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              .m_storage.m_cols;
    }
    lVar8 = lVar8 * lVar13;
    pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    uVar12 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar8) {
      lVar13 = 0;
      do {
        pdVar3 = pdVar17 + lVar13;
        dVar6 = pdVar3[1];
        pdVar4 = pdVar14 + lVar13;
        dVar19 = pdVar4[1];
        pdVar1 = pdVar5 + lVar13;
        *pdVar1 = *pdVar3 + *pdVar4;
        pdVar1[1] = dVar6 + dVar19;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar12);
    }
    if ((long)uVar12 < lVar8) {
      do {
        pdVar5[uVar12] = pdVar17[uVar12] + pdVar14[uVar12];
        uVar12 = uVar12 + 1;
      } while (lVar8 - uVar12 != 0);
    }
    local_78.m_lhs = (LhsNested)this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&this->pred_z_var,(SrcXprType *)&local_78,(assign_op<double,_double> *)&local_a0);
    local_78.m_lhs = (LhsNested)dst;
    local_78.m_rhs.m_lhs.m_rhs.m_matrix = &this->pred_z_var;
    local_78.m_rhs.m_rhs = (RhsNested)dst;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
              (&this->p_x_invVar,
               (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                *)&local_78,(assign_op<double,_double> *)&local_a0,(type)0x0);
    lVar13 = (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar8 = (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    if (lVar13 <= lVar8) {
      lVar8 = lVar13;
    }
    if (0 < lVar8) {
      pdVar17 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      pdVar14 = (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar16 = 0;
      do {
        *pdVar14 = pdVar17[lVar16] + *pdVar14;
        lVar16 = lVar16 + 1;
        pdVar14 = pdVar14 + lVar13 + 1;
      } while (lVar8 != lVar16);
    }
    if (lVar13 == 0) {
      dVar19 = 1.0;
    }
    else {
      Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_78,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->p_x_invVar);
      RVar9.m_matrix = local_78.m_rhs.m_lhs.m_rhs.m_matrix;
      if ((long)local_78.m_rhs.m_lhs.m_lhs <= (long)local_78.m_rhs.m_lhs.m_rhs.m_matrix) {
        RVar9.m_matrix = local_78.m_rhs.m_lhs.m_lhs;
      }
      if (RVar9.m_matrix == (XZ *)0x0) {
        pdVar17 = (double *)0x3ff0000000000000;
      }
      else {
        pdVar17 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   &(local_78.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   )->m_storage).m_data;
        if (1 < (long)RVar9.m_matrix) {
          puVar10 = (undefined1 *)
                    ((long)&RVar9.m_matrix[-1].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols + 7);
          pIVar15 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                      &(local_78.m_lhs)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)->m_storage).
                     m_rows + (long)local_78.m_rhs.m_lhs.m_lhs;
          do {
            pdVar17 = (double *)((double)pdVar17 * (double)*pIVar15);
            pIVar15 = pIVar15 + (long)((long)&((local_78.m_rhs.m_lhs.m_lhs)->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                              ).m_storage.m_data + 1);
            puVar10 = puVar10 + -1;
          } while (puVar10 != (undefined1 *)0x0);
        }
      }
      local_c0 = (double)(int)local_38 * (double)pdVar17;
      free(local_50);
      free(local_78.m_rhs.m_rhs);
      free(local_78.m_lhs);
      dVar19 = local_c0;
    }
    if (dVar19 < 0.0) {
      SVar18 = sqrt(dVar19);
    }
    else {
      SVar18 = SQRT(dVar19);
    }
    this->p_x_invVarSqrtDet = SVar18;
    this->recompute = false;
  }
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8,
             (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows,1);
  pdVar17 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar14 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar12 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
      uVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8,uVar12,1);
    uVar12 = local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
  }
  uVar11 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar12) {
    lVar13 = 0;
    do {
      pdVar5 = pdVar17 + lVar13;
      dVar19 = pdVar5[1];
      pdVar1 = pdVar14 + lVar13;
      dVar6 = pdVar1[1];
      ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                  local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data)->m_storage).m_data + lVar13;
      *ppdVar2 = (double *)(*pdVar5 - *pdVar1);
      ppdVar2[1] = (double *)(dVar19 - dVar6);
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar12) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
         local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
        ->m_storage).m_data)[uVar11] = (double *)(pdVar17[uVar11] - pdVar14[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  local_78.m_lhs = &this->Nu;
  local_78.m_rhs.m_lhs.m_rhs.m_matrix = &this->PsiLambda;
  local_78.m_rhs.m_lhs.m_lhs = &this->pred_z_var;
  local_78.m_rhs.m_rhs = (RhsNested)&local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            (&this->pred_z,&local_78,(assign_op<double,_double> *)&local_a0,(type)0x0);
  local_c0 = this->p_x_invVarSqrtDet;
  local_a0.m_rhs.m_lhs = &this->p_x_invVar;
  local_a0.m_lhs = (LhsNested)&local_b8;
  local_a0.m_rhs.m_rhs = (RhsNested)&local_b8;
  if ((this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows == 0) {
    dVar19 = -0.0;
  }
  else {
    local_78.m_rhs.m_lhs.m_lhs =
         (LhsNested)
         local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    Eigen::internal::
    product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         *)&local_78.m_rhs.m_lhs.m_rhs,&local_a0.m_rhs);
    local_80 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>,3,0>
               ::
               run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                         ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                           *)&local_78,&local_c1,&local_a0);
    free(local_78.m_rhs.m_rhs);
    dVar19 = local_80 * -0.5;
  }
  dVar19 = exp(dVar19);
  local_c0 = dVar19 * local_c0;
  this->p_x_Norm = local_c0;
  free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return local_c0;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryX( X const &x )
{
    if( recompute )
    {
        PsiLambda = invPsi.asDiagonal() * Lambda;
        LambdaPsiLambda = Lambda.transpose() * PsiLambda;

        // Observation Variance
        pred_z_invVar = invSigma + LambdaPsiLambda;
        pred_z_var = pred_z_invVar.inverse();                      //TODO: Optimize this!

        p_x_invVar = - PsiLambda * pred_z_var * PsiLambda.transpose();
        p_x_invVar += invPsi.asDiagonal();
        p_x_invVarSqrtDet = sqrt(p_x_invVar.determinant());        //TODO: Optimize this!

        // Prediction Variance
//        pred_z_var_factor = pred_z_var * LambdaPsiLambda * pred_z_var;
//        if( wNu == 0.0 )
//            pred_z_var *= 1.0/Sh;
//        else
//        {
//            Z dz = Nu - Sz/Sh;
//            pred_z_var *= 1.0/Sh + dz.dot( varLambda * dz );
//        }

        recompute = false;
    }

    X dx = x - Mu;

    pred_z = Nu + pred_z_var * PsiLambda.transpose() * dx;
    p_x_Norm = p_x_invVarSqrtDet * exp( -0.5 * dx.dot(p_x_invVar * dx) );

    return p_x_Norm;
}